

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::getTestTailCallee
          (TestInterfaceImpl *this,GetTestTailCalleeContext context)

{
  Own<capnp::_::TestTailCalleeImpl,_std::nullptr_t> local_80;
  undefined1 local_70 [24];
  CallContext<capnproto_test::capnp::test::TestInterface::GetTestTailCalleeParams,_capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults>
  local_58;
  Builder local_50;
  Maybe<capnp::MessageSize> local_28;
  
  local_28.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestInterface::GetTestTailCalleeParams,_capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults>
  ::getResults(&local_50,&local_58,&local_28);
  kj::heap<capnp::_::TestTailCalleeImpl,int&>
            ((kj *)&local_80,(int *)context.hook[1]._vptr_CallContextHook);
  capnproto_test::capnp::test::TestTailCallee::Client::Client<capnp::_::TestTailCalleeImpl,void>
            ((Client *)local_70,&local_80);
  capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults::Builder::setCap
            (&local_50,(Client *)local_70);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_70 + 8));
  kj::Own<capnp::_::TestTailCalleeImpl,_std::nullptr_t>::dispose(&local_80);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestInterfaceImpl::getTestTailCallee(GetTestTailCalleeContext context) {
  context.getResults().setCap(kj::heap<TestTailCalleeImpl>(callCount));
  return kj::READY_NOW;
}